

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegerCondition.hpp
# Opt level: O3

Status __thiscall
AO::BehaviorTree::Version_1::Details::IntegerCondition<int,_Agent,_short>::decide
          (IntegerCondition<int,_Agent,_short> *this,EntityPtr entity,short args)

{
  int iVar1;
  bool bVar2;
  short local_12;
  EntityPtr local_10;
  
  local_12 = args;
  local_10 = entity;
  if ((this->function).super__Function_base._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  iVar1 = (*(this->function)._M_invoker)((_Any_data *)&this->function,&local_10,&local_12);
  switch(this->condition) {
  case LessThan:
    bVar2 = this->target <= iVar1;
    break;
  case GreaterThan:
    bVar2 = iVar1 <= this->target;
    break;
  case LessOrEqualThan:
    bVar2 = this->target < iVar1;
    break;
  case GreaterOrEqualThan:
    bVar2 = iVar1 < this->target;
    break;
  case Equal:
    bVar2 = iVar1 != this->target;
    break;
  case NotEqual:
    bVar2 = iVar1 == this->target;
    break;
  default:
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

Status decide(EntityPtr entity, Args...args) override final
					{
						IntegerType const result = function(entity, args...);
						switch (condition)
						{
						case ConditionTest::LessThan:
							return result < target ? Status::Success : Status::Failure;
						case ConditionTest::GreaterThan:
							return result > target ? Status::Success : Status::Failure;
						case ConditionTest::LessOrEqualThan:
							return result <= target ? Status::Success : Status::Failure;
						case ConditionTest::GreaterOrEqualThan:
							return result >= target ? Status::Success : Status::Failure;
						case ConditionTest::Equal:
							return result == target ? Status::Success : Status::Failure;
						case ConditionTest::NotEqual:
							return result != target ? Status::Success : Status::Failure;
						default:
							return Status::Failure;
						}
					}